

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BubbleValue.cpp
# Opt level: O3

void __thiscall bubbleJson::BubbleValue::MemoryFreeValue(BubbleValue *this)

{
  _Rb_tree_header *p_Var1;
  ValueTypes VVar2;
  ulong uVar3;
  _Base_ptr p_Var4;
  void *pvVar5;
  ulong uVar6;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue>_>_>
  *this_00;
  long lVar7;
  
  this_00 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue>_>_>
             *)(this->u).string.literal;
  VVar2 = this->type;
  if (VVar2 == ValueType_String) {
    free(this_00);
  }
  else {
    if (VVar2 == ValueType_Object) {
      p_Var4 = (this_00->_M_impl).super__Rb_tree_header._M_header._M_left;
      p_Var1 = &(this_00->_M_impl).super__Rb_tree_header;
      if ((_Rb_tree_header *)p_Var4 != p_Var1) {
        do {
          MemoryFreeValue((BubbleValue *)(p_Var4 + 2));
          p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
        } while ((_Rb_tree_header *)p_Var4 != p_Var1);
        this_00 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue>_>_>
                   *)(this->u).string.literal;
        if (this_00 ==
            (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue>_>_>
             *)0x0) {
          this_00 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue>_>_>
                     *)0x0;
          goto LAB_001103a6;
        }
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue>_>_>
      ::~_Rb_tree(this_00);
    }
    else {
      if (VVar2 != ValueType_Array) goto LAB_001103b5;
      pvVar5 = *(void **)&this_00->_M_impl;
      if (*(void **)&(this_00->_M_impl).super__Rb_tree_header._M_header != pvVar5) {
        lVar7 = 0;
        uVar6 = 0;
        do {
          MemoryFreeValue((BubbleValue *)((long)pvVar5 + lVar7));
          uVar6 = uVar6 + 1;
          this_00 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue>_>_>
                     *)(this->u).string.literal;
          pvVar5 = *(void **)&this_00->_M_impl;
          uVar3 = (*(long *)&(this_00->_M_impl).super__Rb_tree_header._M_header - (long)pvVar5 >> 3)
                  * -0x5555555555555555;
          lVar7 = lVar7 + 0x18;
        } while (uVar6 <= uVar3 && uVar3 - uVar6 != 0);
      }
      if (pvVar5 != (void *)0x0) {
        ::operator_delete(pvVar5);
      }
    }
LAB_001103a6:
    ::operator_delete(this_00);
  }
  (this->u).number = 0.0;
LAB_001103b5:
  this->type = ValueType_Null;
  return;
}

Assistant:

void BubbleValue::MemoryFreeValue()
{
    auto members = this->u.object.members;
    switch (this->type)
    {
        case ValueType_String:
            free(this->u.string.literal);
            this->u.string.literal = nullptr;
            break;
        case ValueType_Array:
            for (int i = 0; i < this->u.array.elements->size(); ++i)
            {
                this->u.array.elements->at(i).MemoryFreeValue();
            }
            delete this->u.array.elements;
            this->u.array.elements = nullptr;
            break;
        case ValueType_Object:
            for (auto it = members->begin(); it != members->end(); ++it)
            {
                it->second.MemoryFreeValue();
            }
            delete this->u.object.members;
            this->u.object.members = nullptr;
            break;
        default:
            break;
    }

    this->type = ValueType_Null;
}